

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_TimedText.cpp
# Opt level: O1

MXFReader * __thiscall
AS_02::TimedText::MXFReader::ReadTimedTextResource
          (MXFReader *this,FrameBuffer *FrameBuf,AESDecContext *Ctx,HMACContext *HMAC)

{
  char cVar1;
  
  if ((*(long *)&FrameBuf->field_0x8 != 0) &&
     (cVar1 = (**(code **)(**(long **)(*(long *)&FrameBuf->field_0x8 + 0x10) + 0x40))(),
     cVar1 != '\0')) {
    h__Reader::ReadTimedTextResource
              ((h__Reader *)this,*(FrameBuffer **)&FrameBuf->field_0x8,Ctx,HMAC);
    return this;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_INIT);
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::TimedText::MXFReader::ReadTimedTextResource(ASDCP::TimedText::FrameBuffer& FrameBuf,
						   AESDecContext* Ctx, HMACContext* HMAC) const
{
  if ( m_Reader && m_Reader->m_File->IsOpen() )
    return m_Reader->ReadTimedTextResource(FrameBuf, Ctx, HMAC);

  return RESULT_INIT;
}